

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

void __thiscall helics::ActionMessage::packetize(ActionMessage *this,string *data)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  int iVar4;
  reference pvVar5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  size_type in_RDI;
  ActionMessage *in_stack_00000008;
  uint32_t dsz;
  int size;
  size_t in_stack_00000068;
  byte *in_stack_00000070;
  ActionMessage *in_stack_00000078;
  undefined5 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe5;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  char __c;
  
  iVar4 = serializedByteCount(in_stack_00000008);
  __c = (char)((uint)iVar4 >> 0x18);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffffe7,
                      CONCAT16(in_stack_ffffffffffffffe6,
                               CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0))),
             in_RDI);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffffe7,
                      CONCAT16(in_stack_ffffffffffffffe6,
                               CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0))),
             in_RDI);
  toByteArray(in_stack_00000078,in_stack_00000070,in_stack_00000068);
  pvVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffffe7,
                               CONCAT16(in_stack_ffffffffffffffe6,
                                        CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0
                                                ))),in_RDI);
  *pvVar5 = -0xd;
  sVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_RSI);
  vVar1 = (value_type)(sVar6 >> 0x10);
  pvVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffffe7,
                               CONCAT16(in_stack_ffffffffffffffe6,
                                        CONCAT15(vVar1,in_stack_ffffffffffffffe0))),in_RDI);
  *pvVar5 = vVar1;
  vVar2 = (value_type)(sVar6 >> 8);
  pvVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffffe7,
                               CONCAT16(vVar2,CONCAT15(vVar1,in_stack_ffffffffffffffe0))),in_RDI);
  *pvVar5 = vVar2;
  vVar3 = (value_type)sVar6;
  pvVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(vVar3,CONCAT16(vVar2,CONCAT15(vVar1,in_stack_ffffffffffffffe0))),
                      in_RDI);
  *pvVar5 = vVar3;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (in_RSI,__c);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (in_RSI,__c);
  return;
}

Assistant:

void ActionMessage::packetize(std::string& data) const
{
    auto size = serializedByteCount();
    data.resize(sizeof(uint32_t) + static_cast<size_t>(size));
    toByteArray(reinterpret_cast<std::byte*>(&(data[4])), size);

    data[0] = LEADING_CHAR;
    // now generate a length header
    auto dsz = static_cast<uint32_t>(data.size());
    data[1] = static_cast<char>(((dsz >> 16U) & 0xFFU));
    data[2] = static_cast<char>(((dsz >> 8U) & 0xFFU));
    data[3] = static_cast<char>(dsz & 0xFFU);
    data.push_back(TAIL_CHAR1);
    data.push_back(TAIL_CHAR2);
}